

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

bool __thiscall QFileDialogPrivate::itemAlreadyExists(QFileDialogPrivate *this,QString *fileName)

{
  StandardButton SVar1;
  QWidget *parent;
  undefined8 in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  StandardButton res;
  QFileDialog *q;
  QString msg;
  undefined8 in_stack_ffffffffffffff38;
  int n;
  enum_type in_stack_ffffffffffffff40;
  enum_type f1;
  QWidget *this_00;
  undefined8 in_stack_ffffffffffffff50;
  int fieldWidth;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QFlagsStorage<QMessageBox::StandardButton> buttons;
  QString *in_stack_ffffffffffffff60;
  QChar local_42;
  undefined1 local_40 [32];
  QWidgetData *pQStack_20;
  undefined1 *local_18;
  long local_8;
  
  SVar1 = (StandardButton)((ulong)in_RSI >> 0x20);
  fieldWidth = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  n = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  parent = (QWidget *)q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_40._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  f1 = NoButton;
  this_00 = (QWidget *)local_40;
  QFileDialog::tr((char *)this_00,(char *)(ulong)(uint)in_stack_ffffffffffffff40,n);
  QChar::QChar<char16_t,_true>(&local_42,L' ');
  QString::arg<QString,_true>
            (in_stack_ffffffffffffff60,
             (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),fieldWidth,
             (QChar)(char16_t)((ulong)parent >> 0x30));
  QString::~QString((QString *)0x75bb79);
  QWidget::windowTitle(this_00);
  buttons.i = 0x10000;
  ::operator|(f1,in_stack_ffffffffffffff40);
  SVar1 = QMessageBox::warning
                    (parent,(QString *)this_00,(QString *)CONCAT44(f1,in_stack_ffffffffffffff40),
                     (StandardButtons)buttons.i,SVar1);
  QString::~QString((QString *)0x75bbd4);
  QString::~QString((QString *)0x75bbf6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar1 == Yes;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::itemAlreadyExists(const QString &fileName)
{
#if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
    const QString msg = QFileDialog::tr("%1 already exists.\nDo you want to replace it?").arg(fileName);
    using B = QMessageBox;
    const auto res = B::warning(q, q->windowTitle(), msg, B::Yes | B::No, B::No);
    return res == B::Yes;
#endif
    return false;
}